

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::doPendingFunctors(EventLoop *this)

{
  size_t i;
  ulong uVar1;
  pointer pfVar2;
  pointer pfVar3;
  long lVar4;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_40;
  
  this->callingPendingFunctors_ = true;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  pfVar3 = (this->pendingFunctors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->pendingFunctors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->pendingFunctors_).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar3;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar2;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  lVar4 = 0;
  for (uVar1 = 0; uVar1 < (ulong)((long)pfVar2 - (long)pfVar3 >> 5); uVar1 = uVar1 + 1) {
    std::function<void_()>::operator()
              ((function<void_()> *)((long)&(pfVar3->super__Function_base)._M_functor + lVar4));
    lVar4 = lVar4 + 0x20;
    pfVar2 = local_40.
             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pfVar3 = local_40.
             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  this->callingPendingFunctors_ = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_40);
  return;
}

Assistant:

void EventLoop::doPendingFunctors(){
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;

    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFunctors_);
    }

    for (size_t i = 0; i < functors.size(); i++)
    {
        functors[i]();
    }
    callingPendingFunctors_ = false;
}